

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

int __thiscall
soplex::SPxScaler<double>::computeScaleExp
          (SPxScaler<double> *this,SVectorBase<double> *vec,DataArray<int> *oldScaleExp)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar1;
  long lVar2;
  double dVar3;
  Real RVar4;
  ulong uVar5;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  int scaleExp;
  int local_6c;
  Real local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  if (0 < vec->memused) {
    dVar3 = 0.0;
    uVar5 = 0;
    lVar2 = 8;
    lVar1 = 0;
    do {
      local_48 = dVar3;
      uStack_40 = uVar5;
      local_58 = ldexp(*(double *)((long)vec->m_elem + lVar2 + -8),
                       oldScaleExp->data[*(int *)((long)&vec->m_elem->val + lVar2)]);
      this_00 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      uStack_50 = extraout_XMM0_Qb;
      RVar4 = Tolerances::epsilon(this_00);
      uStack_60 = extraout_XMM0_Qb_00;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_68 = RVar4;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        RVar4 = local_68;
      }
      uVar5 = -(ulong)(RVar4 < ABS(local_58) - local_48);
      dVar3 = (double)(~uVar5 & (ulong)local_48 | uVar5 & (ulong)ABS(local_58));
      uVar5 = ~uStack_60 & uStack_40 | uStack_60 & uStack_50 & 0x7fffffffffffffff;
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < vec->memused);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      frexp(1.0 / dVar3,&local_6c);
      return local_6c + -1;
    }
  }
  return 0;
}

Assistant:

int SPxScaler<R>::computeScaleExp(const SVectorBase<R>& vec,
                                  const DataArray<int>& oldScaleExp) const
{
   R maxi = 0.0;

   // find largest absolute value after applying existing scaling factors
   for(int i = 0; i < vec.size(); ++i)
   {
      R x = spxAbs(spxLdexp(vec.value(i), oldScaleExp[vec.index(i)]));

      if(GT(x, maxi, this->tolerances()->epsilon()))
         maxi = x;
   }

   // empty rows/cols are possible
   if(maxi == 0.0)
      return 0;
   // get exponent corresponding to new scaling factor
   else
   {
      int scaleExp;
      spxFrexp(R(1.0 / maxi), &(scaleExp));
      return scaleExp - 1;
   }
}